

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O1

int header_newc(archive_read *a,cpio *cpio,archive_entry *entry,size_t *namelength,size_t *name_pad)

{
  byte bVar1;
  bool bVar2;
  cpio *pcVar3;
  int *piVar4;
  char *pcVar5;
  dev_t dVar6;
  int64_t iVar7;
  size_t sVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int *piVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  int *piVar17;
  ssize_t bytes;
  long local_48;
  cpio *local_40;
  ulong *local_38;
  
  local_40 = cpio;
  local_38 = name_pad;
  piVar4 = (int *)__archive_read_ahead(a,0x6e,&local_48);
  iVar11 = -0x1e;
  bVar2 = true;
  if (piVar4 != (int *)0x0) {
    lVar16 = 0;
    do {
      if (((char)piVar4[1] == '0' && *piVar4 == 0x37303730) &&
         ((byte)(*(char *)((long)piVar4 + 5) - 0x31U) < 2)) {
        lVar10 = -0x6e;
        while ((bVar1 = *(byte *)((long)piVar4 + lVar10 + 0x6e), (byte)(bVar1 - 0x30) < 10 ||
               ((uVar14 = bVar1 - 0x41, uVar14 < 0x26 &&
                ((0x3f0000003fU >> ((ulong)uVar14 & 0x3f) & 1) != 0))))) {
          lVar10 = lVar10 + 1;
          if (lVar10 == 0) goto LAB_0023c592;
        }
      }
      piVar17 = piVar4;
      if (0x6d < local_48) {
        piVar12 = piVar4;
        do {
          if (*(byte *)((long)piVar12 + 5) - 0x31 < 2) {
            lVar10 = 2;
            if ((char)piVar12[1] == '0' && *piVar12 == 0x37303730) {
              lVar15 = -0x6e;
              while ((bVar1 = *(byte *)((long)piVar12 + lVar15 + 0x6e), (byte)(bVar1 - 0x30) < 10 ||
                     ((uVar14 = bVar1 - 0x41, uVar14 < 0x26 &&
                      ((0x3f0000003fU >> ((ulong)uVar14 & 0x3f) & 1) != 0))))) {
                lVar15 = lVar15 + 1;
                if (lVar15 == 0) {
                  __archive_read_consume(a,(long)piVar12 - (long)piVar4);
                  uVar13 = ((long)piVar12 - (long)piVar4) + lVar16;
                  if (uVar13 == 0) goto LAB_0023c592;
                  archive_set_error(&a->archive,0,"Skipped %d bytes before finding valid header",
                                    uVar13 & 0xffffffff);
                  iVar11 = -0x14;
                  goto LAB_0023c597;
                }
              }
            }
          }
          else {
            lVar10 = 1;
            if (*(byte *)((long)piVar12 + 5) != 0x30) {
              lVar10 = 6;
            }
          }
          piVar17 = (int *)(lVar10 + (long)piVar12);
          uVar13 = (long)piVar12 + lVar10 + 0x6e;
          piVar12 = piVar17;
        } while (uVar13 <= (ulong)(local_48 + (long)piVar4));
      }
      __archive_read_consume(a,(long)piVar17 - (long)piVar4);
      lVar16 = lVar16 + ((long)piVar17 - (long)piVar4);
      piVar4 = (int *)__archive_read_ahead(a,0x6e,&local_48);
    } while (piVar4 != (int *)0x0);
    iVar11 = -0x1e;
  }
LAB_0023c5a0:
  if (bVar2) {
    return iVar11;
  }
  piVar4 = (int *)__archive_read_ahead(a,0x6e,(ssize_t *)0x0);
  if (piVar4 == (int *)0x0) {
    return -0x1e;
  }
  if ((short)piVar4[1] == 0x3130 && *piVar4 == 0x37303730) {
    pcVar5 = "ASCII cpio (SVR4 with no CRC)";
    iVar9 = 0x10004;
  }
  else {
    if ((short)piVar4[1] != 0x3230 || *piVar4 != 0x37303730) goto LAB_0023c61a;
    pcVar5 = "ASCII cpio (SVR4 with CRC)";
    iVar9 = 0x10005;
  }
  (a->archive).archive_format = iVar9;
  (a->archive).archive_format_name = pcVar5;
LAB_0023c61a:
  dVar6 = atol16((char *)((long)piVar4 + 0x3e),8);
  archive_entry_set_devmajor(entry,dVar6);
  dVar6 = atol16((char *)((long)piVar4 + 0x46),8);
  archive_entry_set_devminor(entry,dVar6);
  iVar7 = atol16((char *)((long)piVar4 + 6),8);
  archive_entry_set_ino(entry,iVar7);
  iVar7 = atol16((char *)((long)piVar4 + 0xe),8);
  archive_entry_set_mode(entry,(mode_t)iVar7);
  iVar7 = atol16((char *)((long)piVar4 + 0x16),8);
  archive_entry_set_uid(entry,iVar7);
  iVar7 = atol16((char *)((long)piVar4 + 0x1e),8);
  archive_entry_set_gid(entry,iVar7);
  iVar7 = atol16((char *)((long)piVar4 + 0x26),8);
  archive_entry_set_nlink(entry,(uint)iVar7);
  dVar6 = atol16((char *)((long)piVar4 + 0x4e),8);
  archive_entry_set_rdevmajor(entry,dVar6);
  dVar6 = atol16((char *)((long)piVar4 + 0x56),8);
  archive_entry_set_rdevminor(entry,dVar6);
  iVar7 = atol16((char *)((long)piVar4 + 0x2e),8);
  archive_entry_set_mtime(entry,iVar7,0);
  sVar8 = atol16((char *)((long)piVar4 + 0x5e),8);
  *namelength = sVar8;
  uVar13 = (ulong)(2U - (int)sVar8 & 3);
  *local_38 = uVar13;
  if (CARRY8(uVar13,*namelength)) {
    archive_set_error(&a->archive,0x54,"cpio archive has invalid namelength",uVar13 + *namelength);
    iVar11 = -0x1e;
  }
  else {
    iVar7 = atol16((char *)((long)piVar4 + 0x36),8);
    pcVar3 = local_40;
    local_40->entry_bytes_remaining = iVar7;
    archive_entry_set_size(entry,iVar7);
    pcVar3->entry_padding = (ulong)(-(int)pcVar3->entry_bytes_remaining & 3);
    __archive_read_consume(a,0x6e);
  }
  return iVar11;
LAB_0023c592:
  iVar11 = 0;
LAB_0023c597:
  bVar2 = false;
  goto LAB_0023c5a0;
}

Assistant:

static int
header_newc(struct archive_read *a, struct cpio *cpio,
    struct archive_entry *entry, size_t *namelength, size_t *name_pad)
{
	const void *h;
	const char *header;
	int r;

	r = find_newc_header(a);
	if (r < ARCHIVE_WARN)
		return (r);

	/* Read fixed-size portion of header. */
	h = __archive_read_ahead(a, newc_header_size, NULL);
	if (h == NULL)
	    return (ARCHIVE_FATAL);

	/* Parse out hex fields. */
	header = (const char *)h;

	if (memcmp(header + newc_magic_offset, "070701", 6) == 0) {
		a->archive.archive_format = ARCHIVE_FORMAT_CPIO_SVR4_NOCRC;
		a->archive.archive_format_name = "ASCII cpio (SVR4 with no CRC)";
	} else if (memcmp(header + newc_magic_offset, "070702", 6) == 0) {
		a->archive.archive_format = ARCHIVE_FORMAT_CPIO_SVR4_CRC;
		a->archive.archive_format_name = "ASCII cpio (SVR4 with CRC)";
	} else {
		/* TODO: Abort here? */
	}

	archive_entry_set_devmajor(entry,
		(dev_t)atol16(header + newc_devmajor_offset, newc_devmajor_size));
	archive_entry_set_devminor(entry, 
		(dev_t)atol16(header + newc_devminor_offset, newc_devminor_size));
	archive_entry_set_ino(entry, atol16(header + newc_ino_offset, newc_ino_size));
	archive_entry_set_mode(entry, 
		(mode_t)atol16(header + newc_mode_offset, newc_mode_size));
	archive_entry_set_uid(entry, atol16(header + newc_uid_offset, newc_uid_size));
	archive_entry_set_gid(entry, atol16(header + newc_gid_offset, newc_gid_size));
	archive_entry_set_nlink(entry,
		(unsigned int)atol16(header + newc_nlink_offset, newc_nlink_size));
	archive_entry_set_rdevmajor(entry,
		(dev_t)atol16(header + newc_rdevmajor_offset, newc_rdevmajor_size));
	archive_entry_set_rdevminor(entry,
		(dev_t)atol16(header + newc_rdevminor_offset, newc_rdevminor_size));
	archive_entry_set_mtime(entry, atol16(header + newc_mtime_offset, newc_mtime_size), 0);
	*namelength = (size_t)atol16(header + newc_namesize_offset, newc_namesize_size);
	/* Pad name to 2 more than a multiple of 4. */
	*name_pad = (2 - *namelength) & 3;

	/* Make sure that the padded name length fits into size_t. */
	if (*name_pad > SIZE_MAX - *namelength) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "cpio archive has invalid namelength");
		return (ARCHIVE_FATAL);
	}

	/*
	 * Note: entry_bytes_remaining is at least 64 bits and
	 * therefore guaranteed to be big enough for a 33-bit file
	 * size.
	 */
	cpio->entry_bytes_remaining =
	    atol16(header + newc_filesize_offset, newc_filesize_size);
	archive_entry_set_size(entry, cpio->entry_bytes_remaining);
	/* Pad file contents to a multiple of 4. */
	cpio->entry_padding = 3 & -cpio->entry_bytes_remaining;
	__archive_read_consume(a, newc_header_size);
	return (r);
}